

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i)

{
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  int64_t j;
  long local_20;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x31,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
  }
  if (in_RDX < in_RSI[1]) {
    if (*in_RDI == in_RSI[2]) {
      for (local_20 = 0; local_20 < in_RSI[2]; local_20 = local_20 + 1) {
        *(float *)(in_RDI[1] + local_20 * 4) =
             *(float *)(*in_RSI + (in_RDX * in_RSI[2] + local_20) * 4) +
             *(float *)(in_RDI[1] + local_20 * 4);
      }
      return;
    }
    __assert_fail("m_ == A.n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x33,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
  }
  __assert_fail("i < A.m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                ,0x32,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i) {
  //std::cout << A.m_ << std::endl;
  //std::cout << A.n_ << std::endl;
  assert(i >= 0);
  assert(i < A.m_);
  assert(m_ == A.n_);
  for (int64_t j = 0; j < A.n_; j++) {
    data_[j] += A.data_[i * A.n_ + j];
  }
}